

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O1

void lm_trie_build(lm_trie_t *trie,ngram_raw_t **raw_ngrams,uint32 *counts,uint32 *out_counts,
                  int order)

{
  uint32 *puVar1;
  middle_t *pmVar2;
  int *piVar3;
  ulong uVar4;
  byte bVar5;
  ngram_raw_t *pnVar6;
  unigram_t *puVar7;
  longest_t *plVar8;
  uint8 *puVar9;
  undefined8 uVar10;
  lm_trie_t *plVar11;
  priority_queue_t *ppVar12;
  long *plVar13;
  undefined8 *element;
  middle_t *pmVar14;
  uint uVar15;
  int order_00;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  middle_t *pmVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  float *pfVar23;
  bool bVar24;
  float prob;
  bitarr_address_t address;
  bitarr_address_t address_00;
  bitarr_address_t bVar25;
  bitarr_address_t address_01;
  uint local_94;
  ulong local_90;
  float *local_88;
  uint *local_80;
  void *local_78;
  priority_queue_t *local_70;
  lm_trie_t *local_68;
  uint32 local_5c;
  ngram_raw_t **local_58;
  uint32 *local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  lm_trie_fix_counts(raw_ngrams,counts,out_counts,order);
  lm_trie_alloc_ngram(trie,out_counts,order);
  local_90 = (ulong)(uint)order;
  if (1 < order) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
            ,0x20a,"Training quantizer\n");
  }
  if (2 < (int)local_90) {
    uVar22 = local_90 & 0xffffffff;
    uVar20 = 2;
    do {
      lm_trie_quant_train(trie->quant,(int)uVar20,counts[uVar20 - 1],raw_ngrams[uVar20 - 2]);
      uVar20 = uVar20 + 1;
    } while (uVar22 != uVar20);
  }
  iVar18 = (int)local_90;
  sVar21 = (size_t)iVar18;
  local_58 = raw_ngrams;
  lm_trie_quant_train_prob(trie->quant,iVar18,counts[sVar21 - 1],raw_ngrams[sVar21 - 2]);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
          ,0x212,"Building LM trie\n");
  local_94 = 0;
  local_5c = *counts;
  ppVar12 = priority_queue_create(sVar21,ngram_ord_comparator);
  local_80 = (uint *)__ckd_calloc__(sVar21,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                    ,0x107);
  local_50 = counts;
  local_88 = (float *)__ckd_calloc__((long)(iVar18 + -1),4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                     ,0x108);
  plVar13 = (long *)__ckd_calloc__(1,0x18,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                   ,0x109);
  *(undefined4 *)(plVar13 + 2) = 1;
  *plVar13 = (long)&local_94;
  local_70 = ppVar12;
  priority_queue_add(ppVar12,plVar13);
  puVar1 = local_50;
  local_78 = __ckd_calloc__((long)(iVar18 + -1),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                            ,0x10e);
  if (1 < iVar18) {
    iVar18 = (int)local_90;
    uVar22 = 2;
    do {
      if (puVar1[uVar22 - 1] != 0) {
        *(undefined4 *)((long)local_78 + uVar22 * 4 + -8) = 0;
        element = (undefined8 *)
                  __ckd_calloc__(1,0x18,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                 ,0x117);
        pnVar6 = local_58[uVar22 - 2];
        element[2] = *(undefined8 *)&pnVar6->order;
        uVar10 = *(undefined8 *)&pnVar6->prob;
        *element = pnVar6->words;
        element[1] = uVar10;
        *(int *)(element + 2) = (int)uVar22;
        priority_queue_add(local_70,element);
      }
      uVar22 = uVar22 + 1;
    } while (iVar18 + 1 != uVar22);
  }
  local_38 = (ulong)((int)local_90 == 2) * 0x10 + 0x18;
  ppVar12 = local_70;
  pfVar23 = local_88;
  local_68 = trie;
  do {
    while( true ) {
      plVar13 = (long *)priority_queue_poll(ppVar12);
      if ((int)plVar13[2] != 1) break;
      puVar7 = trie->unigrams;
      puVar7[local_94].next =
           *(uint32 *)(*(long *)((long)trie->backoff_cache + local_38 + -0x38) + 0x10);
      *local_80 = local_94;
      *pfVar23 = puVar7[local_94].prob;
      uVar15 = local_94 + 1;
      bVar24 = local_94 == local_5c;
      local_94 = uVar15;
      if (bVar24) {
        ckd_free(plVar13);
        sVar21 = priority_queue_size(ppVar12);
        if (sVar21 == 0) {
          priority_queue_free(ppVar12,(_func_void_void_ptr *)0x0);
          ckd_free(local_78);
          ckd_free(local_80);
          ckd_free(pfVar23);
          pmVar14 = trie->middle_begin;
          if (pmVar14 != trie->middle_end) {
            pmVar16 = trie->middle_end;
            if (pmVar14 != pmVar16 + -1) {
              do {
                pmVar2 = pmVar14 + 1;
                bVar5 = (pmVar14->next_mask).bits;
                address.offset =
                     (uint)(pmVar14->base).total_bits * ((pmVar14->base).insert_index + 1) -
                     (uint)bVar5;
                address.base = (pmVar14->base).base;
                address._12_4_ = 0;
                bitarr_write_int25(address,bVar5,pmVar14[1].base.insert_index);
                pmVar16 = trie->middle_end;
                pmVar14 = pmVar2;
              } while (pmVar2 != pmVar16 + -1);
            }
            bVar5 = pmVar16[-1].next_mask.bits;
            address_00.offset =
                 (uint)pmVar16[-1].base.total_bits * (pmVar16[-1].base.insert_index + 1) -
                 (uint)bVar5;
            address_00.base = pmVar16[-1].base.base;
            address_00._12_4_ = 0;
            bitarr_write_int25(address_00,bVar5,(trie->longest->base).insert_index);
          }
          return;
        }
        __assert_fail("priority_queue_size(ngrams) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                      ,0x160,"void recursive_insert(lm_trie_t *, ngram_raw_t **, uint32 *, int)");
      }
LAB_00111eb3:
      priority_queue_add(ppVar12,plVar13);
    }
    local_48 = -0x30;
    uVar20 = 0;
    uVar22 = extraout_RDX;
    do {
      plVar11 = local_68;
      pfVar23 = local_88;
      local_40 = uVar20;
      if (local_80[uVar20] != *(uint *)(*plVar13 + uVar20 * 4)) {
        if (uVar20 == 0) {
          __assert_fail("i > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                        ,0x131,"void recursive_insert(lm_trie_t *, ngram_raw_t **, uint32 *, int)");
        }
        uVar17 = uVar20;
        lVar19 = local_48;
        if (uVar20 < (int)plVar13[2] - 1) {
          do {
            uVar4 = uVar17 + 1;
            bVar25 = middle_insert((middle_t *)(&(plVar11->middle_begin->base).word_bits + lVar19),
                                   *(uint32 *)(*plVar13 + uVar17 * 4),(int)uVar22,(int)uVar20);
            prob = pfVar23[uVar17 - 1] + plVar11->unigrams[*(uint *)(*plVar13 + uVar17 * 4)].bo;
            pfVar23[uVar17] = prob;
            uVar15 = (int)uVar17 - 1;
            uVar20 = (ulong)uVar15;
            lm_trie_quant_mwrite(plVar11->quant,bVar25,uVar15,(float32)prob,0.0);
            lVar19 = lVar19 + 0x30;
            uVar22 = extraout_RDX_00;
            uVar17 = uVar4;
          } while (uVar4 < (int)plVar13[2] - 1);
        }
      }
      uVar20 = local_40 + 1;
      uVar22 = (ulong)*(uint *)(plVar13 + 2);
      local_48 = local_48 + 0x30;
    } while (uVar20 < *(uint *)(plVar13 + 2) - 1);
    memcpy(local_80,(void *)*plVar13,uVar22 << 2);
    trie = local_68;
    iVar18 = (int)plVar13[2];
    if (iVar18 == (int)local_90) {
      plVar8 = local_68->longest;
      uVar15 = *(uint *)(*plVar13 + (ulong)(iVar18 - 1) * 4);
      if ((plVar8->base).word_mask < uVar15) {
        __assert_fail("index <= longest->base.word_mask",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                      ,0x99,"bitarr_address_t longest_insert(longest_t *, uint32)");
      }
      puVar9 = (plVar8->base).base;
      iVar18 = (uint)(plVar8->base).total_bits * (plVar8->base).insert_index;
      bVar25.offset = iVar18;
      bVar25.base = puVar9;
      bVar25._12_4_ = 0;
      bitarr_write_int25(bVar25,(plVar8->base).word_bits,uVar15);
      puVar1 = &(plVar8->base).insert_index;
      *puVar1 = *puVar1 + 1;
      address_01.offset = (uint)(plVar8->base).word_bits + iVar18;
      address_01.base = puVar9;
      address_01._12_4_ = 0;
      lm_trie_quant_lwrite(trie->quant,address_01,*(float32 *)(plVar13 + 1));
      pfVar23 = local_88;
    }
    else {
      bVar25 = middle_insert(local_68->middle_begin + (iVar18 - 2),
                             *(uint32 *)(*plVar13 + (ulong)(iVar18 - 1) * 4),order_00,(int)*plVar13)
      ;
      pfVar23 = local_88;
      lVar19 = plVar13[2];
      local_88[(int)lVar19 - 1] = *(float *)(plVar13 + 1);
      lm_trie_quant_mwrite
                (trie->quant,bVar25,(int)lVar19 + -2,*(float32 *)(plVar13 + 1),
                 *(float32 *)((long)plVar13 + 0xc));
    }
    ppVar12 = local_70;
    piVar3 = (int *)((long)local_78 + (ulong)((int)plVar13[2] - 2) * 4);
    *piVar3 = *piVar3 + 1;
    uVar22 = (ulong)((int)plVar13[2] - 2);
    uVar15 = *(uint *)((long)local_78 + uVar22 * 4);
    if (uVar15 < local_50[(int)plVar13[2] - 1]) {
      pnVar6 = local_58[uVar22];
      plVar13[2] = *(long *)&pnVar6[uVar15].order;
      pnVar6 = pnVar6 + uVar15;
      lVar19 = *(long *)&pnVar6->prob;
      *plVar13 = (long)pnVar6->words;
      plVar13[1] = lVar19;
      goto LAB_00111eb3;
    }
    ckd_free(plVar13);
  } while( true );
}

Assistant:

void
lm_trie_build(lm_trie_t * trie, ngram_raw_t ** raw_ngrams, uint32 * counts, uint32 *out_counts,
              int order)
{
    int i;

    lm_trie_fix_counts(raw_ngrams, counts, out_counts, order);
    lm_trie_alloc_ngram(trie, out_counts, order);
    
    if (order > 1)
        E_INFO("Training quantizer\n");
    for (i = 2; i < order; i++) {
        lm_trie_quant_train(trie->quant, i, counts[i - 1],
                            raw_ngrams[i - 2]);
    }
    lm_trie_quant_train_prob(trie->quant, order, counts[order - 1],
                             raw_ngrams[order - 2]);

    E_INFO("Building LM trie\n");
    recursive_insert(trie, raw_ngrams, counts, order);
    /* Set ending offsets so the last entry will be sized properly */
    /* Last entry for unigrams was already set. */
    if (trie->middle_begin != trie->middle_end) {
        middle_t *middle_ptr;
        for (middle_ptr = trie->middle_begin;
             middle_ptr != trie->middle_end - 1; ++middle_ptr) {
            middle_t *next_middle_ptr = middle_ptr + 1;
            middle_finish_loading(middle_ptr,
                                  next_middle_ptr->base.insert_index);
        }
        middle_ptr = trie->middle_end - 1;
        middle_finish_loading(middle_ptr,
                              trie->longest->base.insert_index);
    }
}